

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_iso9660_filename.c
# Opt level: O0

void verify_file(archive *a,vtype type,fns *fns)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  time_t tVar4;
  la_int64_t v2;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  archive_conflict *paVar8;
  char *pcVar9;
  bool local_52;
  bool local_51;
  size_t length;
  char *symlinkname;
  char *pathname;
  char *p;
  archive_entry *paStack_28;
  int i;
  archive_entry *ae;
  fns *fns_local;
  archive *paStack_10;
  vtype type_local;
  archive *a_local;
  
  ae = (archive_entry *)fns;
  fns_local._4_4_ = type;
  paStack_10 = a;
  iVar1 = archive_read_next_header(a,&stack0xffffffffffffffd8);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                      ,L'N',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",paStack_10);
  if (fns_local._4_4_ == ROCKRIDGE) {
    tVar4 = archive_entry_birthtime(paStack_28);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                        ,L'P',2,"2",tVar4,"archive_entry_birthtime(ae)",(void *)0x0);
    tVar4 = archive_entry_atime(paStack_28);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                        ,L'Q',3,"3",tVar4,"archive_entry_atime(ae)",(void *)0x0);
    tVar4 = archive_entry_ctime(paStack_28);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                        ,L'R',4,"4",tVar4,"archive_entry_ctime(ae)",(void *)0x0);
  }
  else {
    wVar2 = archive_entry_birthtime_is_set(paStack_28);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                        ,L'T',0,"0",(long)wVar2,"archive_entry_birthtime_is_set(ae)",(void *)0x0);
    tVar4 = archive_entry_atime(paStack_28);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                        ,L'U',5,"5",tVar4,"archive_entry_atime(ae)",(void *)0x0);
    tVar4 = archive_entry_ctime(paStack_28);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                        ,L'V',5,"5",tVar4,"archive_entry_ctime(ae)",(void *)0x0);
  }
  tVar4 = archive_entry_mtime(paStack_28);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                      ,L'X',5,"5",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
  if (fns_local._4_4_ == ROCKRIDGE) {
    mVar3 = archive_entry_mode(paStack_28);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                     ,L'Z',(uint)(mVar3 == 0x816d),"(S_IFREG | 0555) == archive_entry_mode(ae)",
                     (void *)0x0);
  }
  else {
    mVar3 = archive_entry_mode(paStack_28);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                     ,L'\\',(uint)(mVar3 == 0x8100),"(S_IFREG | 0400) == archive_entry_mode(ae)",
                     (void *)0x0);
  }
  v2 = archive_entry_size(paStack_28);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                      ,L']',0,"0",v2,"archive_entry_size(ae)",(void *)0x0);
  for (p._4_4_ = 0; p._4_4_ < (int)(ae->ae_stat).aest_ctime; p._4_4_ = p._4_4_ + 1) {
    pcVar5 = archive_entry_pathname(paStack_28);
    pcVar6 = archive_entry_symlink(paStack_28);
    if (pcVar6 != (char *)0x0) {
      sVar7 = strlen(pcVar6);
      local_51 = true;
      if ((sVar7 != 1) && (local_51 = true, sVar7 != 0x80)) {
        local_51 = sVar7 == 0xff;
      }
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                       ,L'j',(uint)local_51,"length == 1 || length == 128 || length == 255",
                       (void *)0x0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                          ,L'k',(long)pcVar6[sVar7 - 1],"symlinkname[length-1]",0x78,"\'x\'",
                          (void *)0x0);
    }
    failure("Found duplicate for %s",pcVar5);
    iVar1 = strcmp(*(char **)(*(long *)&(ae->ae_stat).aest_ctime_nsec + (long)p._4_4_ * 8),pcVar5);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                     ,L'n',(uint)(iVar1 != 0),"strcmp(fns->names[i], pathname) != 0",(void *)0x0);
    paVar8 = (archive_conflict *)strlen(pcVar5);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                     ,L'o',(uint)(paVar8 <= ae->archive),
                     "(length = strlen(pathname)) <= fns->maxlen",(void *)0x0);
    if ((archive_conflict *)ae->stat < paVar8) {
      ae->stat = paVar8;
    }
    pcVar6 = strrchr(pcVar5,0x2e);
    pathname = pcVar5;
    if (pcVar6 != (char *)0x0) {
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                       ,L'u',(uint)((ulong)((long)pcVar6 - (long)pcVar5) <=
                                   *(ulong *)&ae->stat_valid),
                       "(size_t)(p - pathname) <= fns->maxflen",(void *)0x0);
      sVar7 = strlen(pcVar6 + 1);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                       ,L'w',(uint)(sVar7 <= (ulong)(ae->ae_stat).aest_atime),
                       "strlen(p+1) <= fns->maxelen",(void *)0x0);
      if (((ae->ae_stat).aest_mtime & 2) != 0) {
        pcVar9 = strchr(pcVar5,0x2e);
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                         ,L'z',(uint)(pcVar9 == pcVar6),"strchr(pathname, \'.\') == p",(void *)0x0);
      }
    }
    while ((*pathname != '\0' && (((ae->ae_stat).aest_mtime & 1) != 0))) {
      local_52 = true;
      if ('`' < *pathname) {
        local_52 = 'z' < *pathname;
      }
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                       ,L'\x80',(uint)local_52,"*p < \'a\' || *p > \'z\'",(void *)0x0);
      pathname = pathname + 1;
    }
    if (((ae->ae_stat).aest_mtime & 4) == 0) {
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                       ,L'\x86',(uint)(*pcVar5 != '.'),"*pathname != \'.\'",(void *)0x0);
    }
  }
  pcVar5 = archive_entry_pathname(paStack_28);
  pcVar5 = strdup(pcVar5);
  iVar1 = (int)(ae->ae_stat).aest_ctime;
  *(int *)&(ae->ae_stat).aest_ctime = iVar1 + 1;
  *(char **)(*(long *)&(ae->ae_stat).aest_ctime_nsec + (long)iVar1 * 8) = pcVar5;
  return;
}

Assistant:

static void
verify_file(struct archive *a, enum vtype type, struct fns *fns)
{
	struct archive_entry *ae;
	int i;

	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	if (type == ROCKRIDGE) {
		assertEqualInt(2, archive_entry_birthtime(ae));
		assertEqualInt(3, archive_entry_atime(ae));
		assertEqualInt(4, archive_entry_ctime(ae));
	} else {
		assertEqualInt(0, archive_entry_birthtime_is_set(ae));
		assertEqualInt(5, archive_entry_atime(ae));
		assertEqualInt(5, archive_entry_ctime(ae));
	}
	assertEqualInt(5, archive_entry_mtime(ae));
	if (type == ROCKRIDGE)
		assert((S_IFREG | 0555) == archive_entry_mode(ae));
	else
		assert((S_IFREG | 0400) == archive_entry_mode(ae));
	assertEqualInt(0, archive_entry_size(ae));

	/*
	 * Check if the same filename does not appear.
	 */
	for (i = 0; i < fns->cnt; i++) {
		const char *p;
		const char *pathname = archive_entry_pathname(ae);
		const char *symlinkname = archive_entry_symlink(ae);
		size_t length;

		if (symlinkname != NULL) {
			length = strlen(symlinkname);
			assert(length == 1 || length == 128 || length == 255);
			assertEqualInt(symlinkname[length-1], 'x');
		}
		failure("Found duplicate for %s", pathname);
		assert(strcmp(fns->names[i], pathname) != 0);
		assert((length = strlen(pathname)) <= fns->maxlen);
		if (length > fns->longest_len)
			fns->longest_len = length;
		p = strrchr(pathname, '.');
		if (p != NULL) {
			/* Check a length of file name. */
			assert((size_t)(p - pathname) <= fns->maxflen);
			/* Check a length of file extension. */
			assert(strlen(p+1) <= fns->maxelen);
			if (fns->opt & ONE_DOT) {
				/* Do not have multi dot. */
				assert(strchr(pathname, '.') == p);
			}
		}
		for (p = pathname; *p; p++) {
			if (fns->opt & UPPER_CASE_ONLY) {
				/* Do not have any lower-case character. */
				assert(*p < 'a' || *p > 'z');
			} else
				break;
		}
		if ((fns->opt & ALLOW_LDOT) == 0)
			/* Do not have a dot at the first position. */
			assert(*pathname != '.');
	}
	/* Save the filename which is appeared to use above next time. */
	fns->names[fns->cnt++] = strdup(archive_entry_pathname(ae));
}